

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrload.c
# Opt level: O0

FT_Error pfr_extra_item_load_stem_snaps(FT_Byte *p,FT_Byte *limit,PFR_PhyFont phy_font)

{
  FT_Memory memory;
  int *piStack_38;
  FT_Error error;
  FT_Int *snaps;
  uint local_28;
  FT_UInt num_horz;
  FT_UInt num_vert;
  FT_UInt count;
  PFR_PhyFont phy_font_local;
  FT_Byte *limit_local;
  FT_Byte *p_local;
  
  piStack_38 = (int *)0x0;
  memory._4_4_ = 0;
  if ((phy_font->vertical).stem_snaps == (FT_Int *)0x0) {
    if (p + 1 <= limit) {
      limit_local = p + 1;
      local_28 = *p & 0xf;
      snaps._4_4_ = (uint)(*p >> 4);
      num_horz = local_28 + snaps._4_4_;
      if (limit_local + num_horz * 2 <= limit) {
        _num_vert = phy_font;
        phy_font_local = (PFR_PhyFont)limit;
        piStack_38 = (int *)ft_mem_realloc(phy_font->memory,4,0,(ulong)num_horz,(void *)0x0,
                                           (FT_Error *)((long)&memory + 4));
        if (memory._4_4_ != 0) {
          return memory._4_4_;
        }
        (_num_vert->vertical).stem_snaps = piStack_38;
        (_num_vert->horizontal).stem_snaps = piStack_38 + local_28;
        for (; num_horz != 0; num_horz = num_horz - 1) {
          *piStack_38 = (int)CONCAT11(*limit_local,limit_local[1]);
          piStack_38 = piStack_38 + 1;
          limit_local = limit_local + 2;
        }
        return 0;
      }
    }
    memory._4_4_ = 8;
  }
  return memory._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  pfr_extra_item_load_stem_snaps( FT_Byte*     p,
                                  FT_Byte*     limit,
                                  PFR_PhyFont  phy_font )
  {
    FT_UInt    count, num_vert, num_horz;
    FT_Int*    snaps  = NULL;
    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = phy_font->memory;


    if ( phy_font->vertical.stem_snaps )
      goto Exit;

    PFR_CHECK( 1 );
    count = PFR_NEXT_BYTE( p );

    num_vert = count & 15;
    num_horz = count >> 4;
    count    = num_vert + num_horz;

    PFR_CHECK( count * 2 );

    if ( FT_NEW_ARRAY( snaps, count ) )
      goto Exit;

    phy_font->vertical.stem_snaps = snaps;
    phy_font->horizontal.stem_snaps = snaps + num_vert;

    for ( ; count > 0; count--, snaps++ )
      *snaps = FT_NEXT_SHORT( p );

  Exit:
    return error;

  Too_Short:
    error = FT_THROW( Invalid_Table );
    FT_ERROR(( "pfr_extra_item_load_stem_snaps:"
               " invalid stem snaps table\n" ));
    goto Exit;
  }